

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::InitializerListNegativeTest::logTestCaseName(InitializerListNegativeTest *this)

{
  TestContext *this_00;
  TestLog *this_01;
  TestError *this_02;
  undefined1 local_198 [8];
  MessageBuilder message;
  TESTED_ERRORS *error;
  InitializerListNegativeTest *this_local;
  
  message.m_str._368_8_ =
       std::
       vector<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
       ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  this_00 = deqp::Context::getTestContext
                      ((this->super_NegativeTestBase).super_TestBase.super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  switch(*(undefined4 *)message.m_str._368_8_) {
  case 0:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [36])"Wrong type in uvec initializer list");
    break;
  case 1:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [36])"Wrong type in ivec initializer list");
    break;
  case 2:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [35])"Wrong type in vec initializer list");
    break;
  case 3:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [35])"Wrong type in mat initializer list");
    break;
  case 4:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [58])"Wrong number of componenets in vec initialize list - less");
    break;
  case 5:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [58])"Wrong number of componenets in vec initialize list - more");
    break;
  case 6:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [63])"Wrong number of componenets in mat initialize list - less rows");
    break;
  case 7:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [66])"Wrong number of componenets in mat initialize list - less columns");
    break;
  case 8:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [63])"Wrong number of componenets in mat initialize list - more rows");
    break;
  case 9:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [66])"Wrong number of componenets in mat initialize list - more columns");
    break;
  case 10:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [32])"Initializer list in constructor");
    break;
  case 0xb:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [31])"Wrong type of structure member");
    break;
  case 0xc:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [41])"Wrong number of structure members - more"
              );
    break;
  case 0xd:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [41])"Wrong number of structure members - less"
              );
    break;
  case 0xe:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [33])"Wrong order of structure members");
    break;
  default:
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3add);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_198);
  return;
}

Assistant:

void InitializerListNegativeTest::logTestCaseName()
{
	const TESTED_ERRORS& error = m_test_cases[m_current_test_case_index];

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	switch (error)
	{
	case TYPE_UIVEC_BOOL:
		message << "Wrong type in uvec initializer list";
		break;
	case TYPE_IVEC_BOOL:
		message << "Wrong type in ivec initializer list";
		break;
	case TYPE_VEC_BOOL:
		message << "Wrong type in vec initializer list";
		break;
	case TYPE_MAT_BOOL:
		message << "Wrong type in mat initializer list";
		break;
	case COMPONENTS_VEC_LESS:
		message << "Wrong number of componenets in vec initialize list - less";
		break;
	case COMPONENTS_VEC_MORE:
		message << "Wrong number of componenets in vec initialize list - more";
		break;
	case COMPONENTS_MAT_LESS_ROWS:
		message << "Wrong number of componenets in mat initialize list - less rows";
		break;
	case COMPONENTS_MAT_LESS_COLUMNS:
		message << "Wrong number of componenets in mat initialize list - less columns";
		break;
	case COMPONENTS_MAT_MORE_ROWS:
		message << "Wrong number of componenets in mat initialize list - more rows";
		break;
	case COMPONENTS_MAT_MORE_COLUMNS:
		message << "Wrong number of componenets in mat initialize list - more columns";
		break;
	case LIST_IN_CONSTRUCTOR:
		message << "Initializer list in constructor";
		break;
	case STRUCT_LAYOUT_MEMBER_TYPE:
		message << "Wrong type of structure member";
		break;
	case STRUCT_LAYOUT_MEMBER_COUNT_MORE:
		message << "Wrong number of structure members - more";
		break;
	case STRUCT_LAYOUT_MEMBER_COUNT_LESS:
		message << "Wrong number of structure members - less";
		break;
	case STRUCT_LAYOUT_MEMBER_ORDER:
		message << "Wrong order of structure members";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	message << tcu::TestLog::EndMessage;
}